

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O1

void __thiscall webrtc::NonlinearBeamformer::InitTargetCovMats(NonlinearBeamformer *this)

{
  Matrix<std::complex<float>_> *this_00;
  float fVar1;
  float fVar2;
  size_t sVar3;
  complex<float> *pcVar4;
  pointer ppcVar5;
  ComplexMatrixF *pCVar6;
  string *result;
  int line;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  _ComplexT _Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  size_t local_1c8;
  ComplexMatrixF *local_1c0;
  ComplexMatrixF *local_1b8;
  NonlinearBeamformer *local_1b0;
  FatalMessage local_1a8;
  
  local_1c0 = this->target_cov_mats_;
  local_1b8 = this->delay_sum_masks_;
  lVar9 = 0;
  local_1b0 = this;
  while( true ) {
    pCVar6 = local_1b8;
    this_00 = &local_1c0[lVar9].super_Matrix<std::complex<float>_>;
    sVar3 = local_1b0->num_input_channels_;
    if ((local_1c0[lVar9].super_Matrix<std::complex<float>_>.num_rows_ != sVar3) ||
       (local_1c0[lVar9].super_Matrix<std::complex<float>_>.num_columns_ != sVar3)) {
      this_00->num_rows_ = sVar3;
      this_00->num_columns_ = sVar3;
      Matrix<std::complex<float>_>::Resize(this_00);
    }
    local_1c8 = CONCAT44(local_1c8._4_4_,1);
    local_1a8._0_8_ = pCVar6[lVar9].super_Matrix<std::complex<float>_>.num_rows_;
    if (local_1a8._0_8_ == 1) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                         ((uint *)&local_1c8,(unsigned_long *)&local_1a8,"1u == in.num_rows()");
    }
    if (result != (string *)0x0) break;
    local_1a8._0_8_ = this_00->num_rows_;
    local_1c8 = pCVar6[lVar9].super_Matrix<std::complex<float>_>.num_columns_;
    if (local_1a8._0_8_ == local_1c8) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_1a8,&local_1c8,
                          "out->num_rows() == in.num_columns()");
    }
    if (result != (string *)0x0) {
      line = 0x9a;
      goto LAB_00176852;
    }
    local_1a8._0_8_ = this_00->num_columns_;
    local_1c8 = pCVar6[lVar9].super_Matrix<std::complex<float>_>.num_columns_;
    if (local_1a8._0_8_ == local_1c8) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_1a8,&local_1c8,
                          "out->num_columns() == in.num_columns()");
    }
    if (result != (string *)0x0) {
      line = 0x9b;
      goto LAB_00176852;
    }
    if (this_00->num_rows_ != 0) {
      pcVar4 = *pCVar6[lVar9].super_Matrix<std::complex<float>_>.elements_.
                super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar5 = (this_00->elements_).
                super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar7 = 0;
      do {
        if (this_00->num_columns_ != 0) {
          uVar8 = 0;
          do {
            fVar1 = *(float *)&pcVar4[uVar8]._M_value;
            fVar2 = *(float *)((long)&pcVar4[uVar8]._M_value + 4);
            fVar12 = (float)pcVar4[uVar7]._M_value;
            fVar13 = (float)(pcVar4[uVar7]._M_value >> 0x20);
            fVar10 = fVar2 * fVar13 + fVar1 * fVar12;
            fVar14 = fVar1 * fVar13 - fVar2 * fVar12;
            _Var11 = CONCAT44(fVar14,fVar10);
            if ((NAN(fVar10)) && (_Var11 = CONCAT44(fVar14,fVar10), NAN(fVar14))) {
              _Var11 = __mulsc3(fVar12,fVar13,fVar1,-fVar2);
            }
            ppcVar5[uVar7][uVar8]._M_value = _Var11;
            uVar8 = uVar8 + 1;
          } while (uVar8 < this_00->num_columns_);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < this_00->num_rows_);
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x81) {
      return;
    }
  }
  line = 0x99;
LAB_00176852:
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/nonlinear_beamformer.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void NonlinearBeamformer::InitTargetCovMats() {
  for (size_t i = 0; i < kNumFreqBins; ++i) {
    target_cov_mats_[i].Resize(num_input_channels_, num_input_channels_);
    TransposedConjugatedProduct(delay_sum_masks_[i], &target_cov_mats_[i]);
  }
}